

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O1

void xml_help(void)

{
  uint messageType;
  CmdOptDesc *pCVar1;
  ctmbstr __ptr;
  ctmbstr __ptr_00;
  ctmbstr ptVar2;
  ctmbstr name;
  CmdOptDesc *pCVar3;
  CmdOptDesc localPos;
  CmdOptDesc local_68;
  
  ptVar2 = tidyLibraryVersion();
  printf("<?xml version=\"1.0\"?>\n<cmdline version=\"%s\">\n",ptVar2);
  pCVar3 = cmdopt_defs;
  do {
    local_68.name2 = pCVar3->name2;
    local_68.name3 = pCVar3->name3;
    local_68.key = pCVar3->key;
    local_68.subKey = pCVar3->subKey;
    local_68.eqconfig = pCVar3->eqconfig;
    local_68.cat = pCVar3->cat;
    local_68._4_4_ = *(undefined4 *)&pCVar3->field_0x4;
    local_68.name1 = pCVar3->name1;
    localize_option_names(&local_68);
    messageType = pCVar3->key;
    printf(" <option class=\"%s\">\n",cmdopt_catname[pCVar3->cat].mnemonic);
    ptVar2 = local_68.name1;
    print_xml_help_option_element("name",local_68.name1);
    __ptr = local_68.name2;
    print_xml_help_option_element("name",local_68.name2);
    __ptr_00 = local_68.name3;
    print_xml_help_option_element("name",local_68.name3);
    name = tidyLocalizedString(messageType);
    print_xml_help_option_element("description",name);
    if (pCVar3->eqconfig == (ctmbstr)0x0) {
      puts("  <eqconfig />");
    }
    else {
      print_xml_help_option_element("eqconfig",local_68.eqconfig);
    }
    puts(" </option>");
    if (ptVar2 != (ctmbstr)0x0) {
      free(ptVar2);
    }
    if (__ptr != (ctmbstr)0x0) {
      free(__ptr);
    }
    if (__ptr_00 != (ctmbstr)0x0) {
      free(__ptr_00);
    }
    if (local_68.eqconfig != (ctmbstr)0x0) {
      free(local_68.eqconfig);
    }
    pCVar1 = pCVar3 + 1;
    pCVar3 = pCVar3 + 1;
  } while (pCVar1->name1 != (ctmbstr)0x0);
  puts("</cmdline>");
  return;
}

Assistant:

static void xml_help( void )
{
    const CmdOptDesc* pos;
    CmdOptDesc localPos;

    printf( "<?xml version=\"1.0\"?>\n"
           "<cmdline version=\"%s\">\n", tidyLibraryVersion());

    for( pos=cmdopt_defs; pos->name1; ++pos)
    {
        localPos = *pos;
        localize_option_names(&localPos);
        printf(" <option class=\"%s\">\n", cmdopt_catname[pos->cat].mnemonic );
        print_xml_help_option_element("name", localPos.name1);
        print_xml_help_option_element("name", localPos.name2);
        print_xml_help_option_element("name", localPos.name3);
        print_xml_help_option_element("description", tidyLocalizedString( pos->key ) );
        if (pos->eqconfig)
            print_xml_help_option_element("eqconfig", localPos.eqconfig);
        else
            printf("  <eqconfig />\n");
        printf(" </option>\n");

        if (localPos.name1) free((tmbstr)localPos.name1);
        if (localPos.name2) free((tmbstr)localPos.name2);
        if (localPos.name3) free((tmbstr)localPos.name3);
        if (localPos.eqconfig) free((tmbstr)localPos.eqconfig); /* Is. #791 */
    }

    printf( "</cmdline>\n" );
}